

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

SceneObject * __thiscall
CMU462::DynamicScene::Mesh::get_transformed_static_object(Mesh *this,double t)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  double dVar2;
  _Base_ptr p_Var3;
  double dVar4;
  _List_node_base *p_Var5;
  double *pdVar6;
  Mesh *this_00;
  pointer pVVar7;
  int i;
  int i_00;
  long lVar8;
  int j;
  int j_00;
  _List_node_base *p_Var9;
  float fVar10;
  float theta;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  Matrix4x4 R_homogeneous;
  Matrix3x3 R;
  Matrix3x3 Rz;
  Matrix3x3 Ry;
  Matrix3x3 Rx;
  Matrix4x4 S;
  Matrix4x4 transform;
  Matrix4x4 T;
  float local_494;
  _Base_ptr local_490;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_478;
  _Base_ptr local_458 [4];
  _Base_ptr local_438;
  _Base_ptr p_Stack_430;
  _List_node_base *local_420;
  _List_node_base *p_Stack_418;
  _List_node_base *local_410;
  Vector4D local_408;
  Matrix4x4 local_3e8;
  Vector3D local_368;
  Matrix4x4 local_350;
  Matrix3x3 local_2d0;
  Matrix3x3 local_288;
  Matrix3x3 local_240;
  Matrix3x3 local_1f8;
  Matrix4x4 local_1b0;
  Matrix4x4 local_130;
  Matrix4x4 local_b0;
  
  local_478.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      0) {
    local_490 = (_Base_ptr)0x0;
    local_438 = (_Base_ptr)0x0;
    p_Stack_430 = (_Base_ptr)0x0;
  }
  else {
    p_Var3 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).positions.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    local_438 = p_Var3[1]._M_parent;
    p_Stack_430 = p_Var3[1]._M_left;
    local_490 = p_Var3[1]._M_right;
  }
  if ((this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      0) {
    local_494 = 0.0;
    fVar10 = 0.0;
    theta = 0.0;
  }
  else {
    p_Var3 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    local_494 = (float)((double)p_Var3[1]._M_parent * 0.017453292519943295);
    fVar10 = (float)((double)p_Var3[1]._M_left * 0.017453292519943295);
    theta = (float)((double)p_Var3[1]._M_right * 0.017453292519943295);
  }
  if ((this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
  {
    local_458[0] = (_Base_ptr)0x0;
    local_458[1] = (_Base_ptr)0x0;
    local_458[2] = (_Base_ptr)0x0;
  }
  else {
    p_Var3 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).scales.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    local_458[0] = p_Var3[1]._M_parent;
    local_458[1] = p_Var3[1]._M_left;
    local_458[2] = p_Var3[1]._M_right;
  }
  Matrix4x4::identity();
  lVar8 = 0;
  do {
    p_Var3 = local_458[lVar8];
    pdVar6 = Matrix4x4::operator()(&local_1b0,(int)lVar8,(int)lVar8);
    *pdVar6 = (double)p_Var3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  rotateMatrix(&local_1f8,1.0,0.0,0.0,local_494);
  rotateMatrix(&local_240,0.0,1.0,0.0,fVar10);
  rotateMatrix(&local_288,0.0,0.0,1.0,theta);
  Matrix3x3::operator*((Matrix3x3 *)&local_350,&local_1f8,&local_240);
  Matrix3x3::operator*(&local_2d0,(Matrix3x3 *)&local_350,&local_288);
  Matrix4x4::identity();
  i_00 = 0;
  do {
    j_00 = 0;
    do {
      pdVar6 = Matrix3x3::operator()(&local_2d0,i_00,j_00);
      dVar2 = *pdVar6;
      pdVar6 = Matrix4x4::operator()(&local_350,i_00,j_00);
      *pdVar6 = dVar2;
      j_00 = j_00 + 1;
    } while (j_00 != 3);
    i_00 = i_00 + 1;
  } while (i_00 != 3);
  local_368.x = (double)local_438;
  local_368.y = (double)p_Stack_430;
  local_368.z = (double)local_490;
  Matrix4x4::translation(&local_368);
  Matrix4x4::operator*(&local_3e8,&local_b0,&local_350);
  Matrix4x4::operator*(&local_130,&local_3e8,&local_1b0);
  plVar1 = &(this->mesh).vertices;
  p_Var9 = (this->mesh).vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)plVar1) {
    do {
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                (&local_478,(value_type *)&p_Var9[1]._M_prev);
      fVar10 = *(float *)((long)&p_Var9[6]._M_prev + 4);
      Vertex::normal((Vector3D *)&local_408,(Vertex *)(p_Var9 + 1));
      dVar2 = (double)fVar10;
      local_3e8.entries[0].z = local_408.z * dVar2 + (double)p_Var9[2]._M_prev;
      dVar4 = (double)p_Var9[2]._M_next + dVar2 * local_408.y;
      local_3e8.entries[0].y._0_4_ = SUB84(dVar4,0);
      local_3e8.entries[0].x = (double)p_Var9[1]._M_prev + dVar2 * local_408.x;
      local_3e8.entries[0].y._4_4_ = (int)((ulong)dVar4 >> 0x20);
      local_3e8.entries[0].w = 1.0;
      Matrix4x4::operator*(&local_130,local_3e8.entries);
      Vector4D::to3D(&local_408);
      p_Var9[2]._M_prev = local_410;
      p_Var9[1]._M_prev = local_420;
      p_Var9[2]._M_next = p_Stack_418;
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != (_List_node_base *)plVar1);
  }
  this_00 = (Mesh *)operator_new(0x38);
  StaticScene::Mesh::Mesh(this_00,&this->mesh,this->bsdf);
  pVVar7 = local_478.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl
           .super__Vector_impl_data._M_start;
  for (p_Var9 = (plVar1->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>)._M_impl.
                _M_node.super__List_node_base._M_next; p_Var9 != (_List_node_base *)plVar1;
      p_Var9 = p_Var9->_M_next) {
    p_Var9[2]._M_prev = (_List_node_base *)pVVar7->z;
    p_Var5 = (_List_node_base *)pVVar7->y;
    p_Var9[1]._M_prev = (_List_node_base *)pVVar7->x;
    p_Var9[2]._M_next = p_Var5;
    pVVar7 = pVVar7 + 1;
  }
  if (local_478.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_478.
                    super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return &this_00->super_SceneObject;
}

Assistant:

StaticScene::SceneObject *Mesh::get_transformed_static_object(double t) {
  vector<Vector3D> originalPositions;

  Vector3D position = positions(t);
  Vector3D rotate = rotations(t) * (PI / 180.);
  Vector3D scale = scales(t);

  Matrix4x4 S = Matrix4x4::identity();
  for (int i = 0; i < 3; i++) S(i, i) = scale[i];

  Matrix3x3 Rx = rotateMatrix(1, 0, 0, rotate[0]);
  Matrix3x3 Ry = rotateMatrix(0, 1, 0, rotate[1]);
  Matrix3x3 Rz = rotateMatrix(0, 0, 1, rotate[2]);

  Matrix3x3 R = Rx * Ry * Rz;
  Matrix4x4 R_homogeneous = Matrix4x4::identity();
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 3; j++) {
      R_homogeneous(i, j) = R(i, j);
    }
  }

  Matrix4x4 T = Matrix4x4::translation(position);

  Matrix4x4 transform = T * R_homogeneous * S;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    originalPositions.push_back(v->position);
    Vector4D tmp = Vector4D(v->position + v->offset * v->normal(), 1.0);
    v->position = (transform * tmp).to3D();
  }

  StaticScene::SceneObject *output = new StaticScene::Mesh(mesh, bsdf);

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position = originalPositions[i++];
  }

  return output;
}